

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O0

void __thiscall Aircraft::Aircraft(Aircraft *this,string *aircraft_data_path)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  istream *this_00;
  long *plVar4;
  ostream *poVar5;
  double dVar6;
  Mat local_4d8;
  Mat local_4c8;
  Mat local_4b8;
  Mat local_4a8;
  Mat local_498;
  Mat local_488;
  Mat local_478;
  Mat local_468;
  double local_458;
  double B_lat_param_list [10];
  double A_lat_param_list [25];
  double local_338;
  double B_long_param_list [8];
  double A_long_param_list [16];
  ifstream file_stream;
  float local_6c;
  string local_68 [4];
  float value;
  string parameter;
  string line;
  string *aircraft_data_path_local;
  Aircraft *this_local;
  
  Mat::Mat(&this->A_long_);
  Mat::Mat(&this->A_lat_);
  Mat::Mat(&this->B_long_);
  Mat::Mat(&this->B_lat_);
  std::__cxx11::string::string((string *)(parameter.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_68);
  std::ifstream::ifstream(A_long_param_list + 0xf,aircraft_data_path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      this_00 = std::operator>>((istream *)(A_long_param_list + 0xf),local_68);
      plVar4 = (long *)std::istream::operator>>(this_00,&local_6c);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar2) break;
      iVar3 = std::__cxx11::string::compare((char *)local_68);
      if (iVar3 == 0) {
        this->mass_ = (double)local_6c;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_68);
        if (iVar3 == 0) {
          this->Xu_ = (double)local_6c;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_68);
          if (iVar3 == 0) {
            this->Xw_ = (double)local_6c;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_68);
            if (iVar3 == 0) {
              this->Zu_ = (double)local_6c;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_68);
              if (iVar3 == 0) {
                this->Zw_ = (double)local_6c;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_68);
                if (iVar3 == 0) {
                  this->Mu_ = (double)local_6c;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_68);
                  if (iVar3 == 0) {
                    this->Mw_ = (double)local_6c;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_68);
                    if (iVar3 == 0) {
                      this->Mq_ = (double)local_6c;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_68);
                      if (iVar3 == 0) {
                        this->Yv_ = (double)local_6c;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_68);
                        if (iVar3 == 0) {
                          this->Yp_ = (double)local_6c;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)local_68);
                          if (iVar3 == 0) {
                            this->Yr_ = (double)local_6c;
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)local_68);
                            if (iVar3 == 0) {
                              this->Lv_ = (double)local_6c;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)local_68);
                              if (iVar3 == 0) {
                                this->Lp_ = (double)local_6c;
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)local_68);
                                if (iVar3 == 0) {
                                  this->Lr_ = (double)local_6c;
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)local_68);
                                  if (iVar3 == 0) {
                                    this->Nv_ = (double)local_6c;
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)local_68);
                                    if (iVar3 == 0) {
                                      this->Np_ = (double)local_6c;
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)local_68);
                                      if (iVar3 == 0) {
                                        this->Nr_ = (double)local_6c;
                                      }
                                      else {
                                        iVar3 = std::__cxx11::string::compare((char *)local_68);
                                        if (iVar3 == 0) {
                                          this->Xde_ = (double)local_6c;
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)local_68);
                                          if (iVar3 == 0) {
                                            this->Zde_ = (double)local_6c;
                                          }
                                          else {
                                            iVar3 = std::__cxx11::string::compare((char *)local_68);
                                            if (iVar3 == 0) {
                                              this->Mde_ = (double)local_6c;
                                            }
                                            else {
                                              iVar3 = std::__cxx11::string::compare
                                                                ((char *)local_68);
                                              if (iVar3 == 0) {
                                                this->Xdt_ = (double)local_6c;
                                              }
                                              else {
                                                iVar3 = std::__cxx11::string::compare
                                                                  ((char *)local_68);
                                                if (iVar3 == 0) {
                                                  this->Mdt_ = (double)local_6c;
                                                }
                                                else {
                                                  iVar3 = std::__cxx11::string::compare
                                                                    ((char *)local_68);
                                                  if (iVar3 == 0) {
                                                    this->Lda_ = (double)local_6c;
                                                  }
                                                  else {
                                                    iVar3 = std::__cxx11::string::compare
                                                                      ((char *)local_68);
                                                    if (iVar3 == 0) {
                                                      this->Nda_ = (double)local_6c;
                                                    }
                                                    else {
                                                      iVar3 = std::__cxx11::string::compare
                                                                        ((char *)local_68);
                                                      if (iVar3 == 0) {
                                                        this->Ydr_ = (double)local_6c;
                                                      }
                                                      else {
                                                        iVar3 = std::__cxx11::string::compare
                                                                          ((char *)local_68);
                                                        if (iVar3 == 0) {
                                                          this->Ldr_ = (double)local_6c;
                                                        }
                                                        else {
                                                          iVar3 = std::__cxx11::string::compare
                                                                            ((char *)local_68);
                                                          if (iVar3 == 0) {
                                                            this->Ndr_ = (double)local_6c;
                                                          }
                                                          else {
                                                            iVar3 = std::__cxx11::string::compare
                                                                              ((char *)local_68);
                                                            if (iVar3 == 0) {
                                                              this->theta0_ = (double)local_6c;
                                                            }
                                                            else {
                                                              iVar3 = std::__cxx11::string::compare
                                                                                ((char *)local_68);
                                                              if (iVar3 == 0) {
                                                                this->alpha0_ = (double)local_6c;
                                                              }
                                                              else {
                                                                iVar3 = std::__cxx11::string::
                                                                        compare((char *)local_68);
                                                                if (iVar3 == 0) {
                                                                  this->U0_ = (double)local_6c;
                                                                }
                                                                else {
                                                                  iVar3 = std::__cxx11::string::
                                                                          compare((char *)local_68);
                                                                  if (iVar3 == 0) {
                                                                    this->W0_ = (double)local_6c;
                                                                  }
                                                                  else {
                                                                    poVar5 = std::operator<<((
                                                  ostream *)&std::cout,
                                                  "Parsing Error: No matching parameter");
                                                  std::ostream::operator<<
                                                            (poVar5,std::
                                                  endl<char,std::char_traits<char>>);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  B_long_param_list[7] = this->Xu_;
  A_long_param_list[0] = this->Xw_;
  A_long_param_list[1] = 0.0;
  dVar6 = cos(this->theta0_);
  A_long_param_list[2] = dVar6 * -9.81;
  A_long_param_list[3] = this->Zu_;
  A_long_param_list[4] = this->Zw_;
  A_long_param_list[5] = this->U0_;
  dVar6 = sin(this->theta0_);
  A_long_param_list[6] = dVar6 * -9.81;
  A_long_param_list[7] = this->Mu_;
  A_long_param_list[8] = this->Mw_;
  A_long_param_list[9] = this->Mq_;
  A_long_param_list[10] = 0.0;
  A_long_param_list[0xb] = 0.0;
  A_long_param_list[0xc] = 0.0;
  A_long_param_list[0xd] = 1.0;
  A_long_param_list[0xe] = 0.0;
  local_338 = this->Xde_;
  B_long_param_list[0] = this->Xdt_;
  B_long_param_list[1] = this->Zde_;
  B_long_param_list[2] = 0.0;
  B_long_param_list[3] = this->Mde_;
  B_long_param_list[4] = this->Mdt_;
  B_long_param_list[5] = 0.0;
  B_long_param_list[6] = 0.0;
  B_lat_param_list[9] = this->Yv_;
  cos(this->theta0_);
  cos(this->theta0_);
  local_458 = 0.0;
  B_lat_param_list[0] = this->Ydr_;
  B_lat_param_list[1] = this->Lda_;
  B_lat_param_list[2] = this->Ldr_;
  B_lat_param_list[3] = this->Nda_;
  B_lat_param_list[4] = this->Ndr_;
  B_lat_param_list[5] = 0.0;
  B_lat_param_list[6] = 0.0;
  B_lat_param_list[7] = 0.0;
  B_lat_param_list[8] = 0.0;
  Mat::Mat(&local_478,4,4,B_long_param_list + 7);
  Mat::operator=(&local_468,&this->A_long_);
  Mat::~Mat(&local_468);
  Mat::~Mat(&local_478);
  Mat::Mat(&local_498,4,2,&local_338);
  Mat::operator=(&local_488,&this->B_long_);
  Mat::~Mat(&local_488);
  Mat::~Mat(&local_498);
  Mat::Mat(&local_4b8,5,5,B_lat_param_list + 9);
  Mat::operator=(&local_4a8,&this->A_lat_);
  Mat::~Mat(&local_4a8);
  Mat::~Mat(&local_4b8);
  Mat::Mat(&local_4d8,5,2,&local_458);
  Mat::operator=(&local_4c8,&this->B_lat_);
  Mat::~Mat(&local_4c8);
  Mat::~Mat(&local_4d8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Aicraft object has been constructed.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream(A_long_param_list + 0xf);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(parameter.field_2._M_local_buf + 8));
  return;
}

Assistant:

Aircraft::Aircraft(const std::string &aircraft_data_path) {
    // Load the aircraft parameters from the text file
    std::string line;
    std::string parameter;
    float value;
    std::ifstream file_stream(aircraft_data_path);
    if (file_stream.is_open()) 
    {
        while (file_stream >> parameter >> value)
        {
            if (parameter.compare("mass") == 0) {
                mass_ = value;
            } else if (parameter.compare("Xu") == 0) {
                Xu_ = value;
            } else if (parameter.compare("Xw") == 0) {
                Xw_ = value;
            } else if (parameter.compare("Zu") == 0) {
                Zu_ = value;
            } else if (parameter.compare("Zw") == 0) {
                Zw_ = value;
            } else if (parameter.compare("Mu") == 0) {
                Mu_ = value;
            } else if (parameter.compare("Mw") == 0) {
                Mw_ = value;
            } else if (parameter.compare("Mq") == 0) {
                Mq_ = value;
            } else if (parameter.compare("Yv") == 0) {
                Yv_ = value;
            } else if (parameter.compare("Yp") == 0) {
                Yp_ = value;
            } else if (parameter.compare("Yr") == 0) {
                Yr_ = value;
            } else if (parameter.compare("Lv") == 0) {
                Lv_ = value;
            } else if (parameter.compare("Lp") == 0) {
                Lp_ = value;
            } else if (parameter.compare("Lr") == 0) {
                Lr_ = value;
            } else if (parameter.compare("Nv") == 0) {
                Nv_ = value;
            } else if (parameter.compare("Np") == 0) {
                Np_ = value;
            } else if (parameter.compare("Nr") == 0) {
                Nr_ = value;
            } else if (parameter.compare("Xde") == 0) {
                Xde_ = value;
            } else if (parameter.compare("Zde") == 0) {
                Zde_ = value;
            } else if (parameter.compare("Mde") == 0) {
                Mde_ = value;
            } else if (parameter.compare("Xdt") == 0) {
                Xdt_ = value;
            } else if (parameter.compare("Mdt") == 0) {
                Mdt_ = value;
            } else if (parameter.compare("Lda") == 0) {
                Lda_ = value;
            } else if (parameter.compare("Nda") == 0) {
                Nda_ = value;
            } else if (parameter.compare("Ydr") == 0) {
                Ydr_ = value;
            } else if (parameter.compare("Ldr") == 0) {
                Ldr_ = value;
            } else if (parameter.compare("Ndr") == 0) {
                Ndr_ = value;
            } else if (parameter.compare("theta0") == 0) {
                theta0_ = value;
            } else if (parameter.compare("alpha0") == 0) {
                alpha0_ = value;
            } else if (parameter.compare("U0") == 0) {
                U0_ = value;
            } else if (parameter.compare("W0") == 0) {
                W0_ = value;
            } else {
                std::cout << "Parsing Error: No matching parameter" << std::endl;
            }      
        }
    }
    
    // Initialize system matrices
    double A_long_param_list[16] = {Xu_, Xw_, 0, -1 * GRAVITY * cos(theta0_),
                                    Zu_, Zw_, U0_, -1* GRAVITY * sin(theta0_),
                                    Mu_, Mw_, Mq_, 0,
                                    0, 0, 1, 0};
    double B_long_param_list[8] = {Xde_, Xdt_,
                                   Zde_, 0,
                                   Mde_, Mdt_,
                                   0, 0};
    double A_lat_param_list[25] = {Yv_, Yp_, -1 * (U0_ - Yr_), GRAVITY * cos(theta0_), 0,
                                   Lv_, Lp_, Lr_, 0, 0,
                                   Nv_, Np_, Nr_, 0, 0,
                                   0, 1, 0, 0, 0,
                                   0, 0, 1 / cos(theta0_), 0, 0};
    double B_lat_param_list[10] = {0, Ydr_,
                                   Lda_, Ldr_,
                                   Nda_, Ndr_,
                                   0, 0,
                                   0, 0};

    A_long_ = Mat(4, 4, A_long_param_list);
    B_long_ = Mat(4, 2, B_long_param_list);
    A_lat_ = Mat(5, 5, A_lat_param_list);
    B_lat_ = Mat(5, 2, B_lat_param_list);

    std::cout << "Aicraft object has been constructed." << std::endl;
}